

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testToFloat"), iVar1 == 0)) {
    testToFloat();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testSize"), iVar1 == 0)) {
    testSize();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testArithmetic"), iVar1 == 0)) {
    testArithmetic();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testNormalizedConversionError"), iVar1 == 0)) {
    testNormalizedConversionError();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testDenormalizedConversionError"), iVar1 == 0)) {
    testDenormalizedConversionError();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testRoundingError"), iVar1 == 0)) {
    testRoundingError();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testBitPatterns"), iVar1 == 0)) {
    testBitPatterns();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testClassification"), iVar1 == 0)) {
    testClassification();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testLimits"), iVar1 == 0)) {
    testLimits();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testHalfLimits"), iVar1 == 0)) {
    testHalfLimits();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testFunction"), iVar1 == 0)) {
    testFunction();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testVec"), iVar1 == 0)) {
    testVec();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testColor"), iVar1 == 0)) {
    testColor();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testShear"), iVar1 == 0)) {
    testShear();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testMatrix"), iVar1 == 0)) {
    testMatrix();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testMiscMatrixAlgo"), iVar1 == 0)) {
    testMiscMatrixAlgo();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testRoots"), iVar1 == 0)) {
    testRoots();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testFun"), iVar1 == 0)) {
    testFun();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testInvert"), iVar1 == 0)) {
    testInvert();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testInterval"), iVar1 == 0)) {
    testInterval();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testFrustum"), iVar1 == 0)) {
    testFrustum();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testRandom"), iVar1 == 0)) {
    testRandom();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testExtractEuler"), iVar1 == 0)) {
    testExtractEuler();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testExtractSHRT"), iVar1 == 0)) {
    testExtractSHRT();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testQuat"), iVar1 == 0)) {
    testQuat();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testQuatSetRotation"), iVar1 == 0)) {
    testQuatSetRotation();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testQuatSlerp"), iVar1 == 0)) {
    testQuatSlerp();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testLineAlgo"), iVar1 == 0)) {
    testLineAlgo();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testBoxAlgo"), iVar1 == 0)) {
    testBoxAlgo();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testBox"), iVar1 == 0)) {
    testBox();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testProcrustes"), iVar1 == 0)) {
    testProcrustes();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testTinySVD"), iVar1 == 0)) {
    testTinySVD();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testJacobiEigenSolver"), iVar1 == 0)) {
    testJacobiEigenSolver();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testFrustumTest"), iVar1 == 0)) {
    testFrustumTest();
  }
  if ((argc < 2) || (iVar1 = strcmp(argv[1],"testInterop"), iVar1 == 0)) {
    testInterop();
  }
  if ((1 < argc) && (iVar1 = strcmp(argv[1],"testNoInterop"), iVar1 != 0)) {
    return 0;
  }
  testNoInterop();
  return 0;
}

Assistant:

int
main (int argc, char* argv[])
{
    // NB: If you add a test here, make sure to enumerate it in the
    // CMakeLists.txt so it runs as part of the test suite
    TEST (testToFloat);
    TEST (testSize);
    TEST (testArithmetic);
    TEST (testNormalizedConversionError);
    TEST (testDenormalizedConversionError);
    TEST (testRoundingError);
    TEST (testBitPatterns);
    TEST (testClassification);
    TEST (testLimits);
    TEST (testHalfLimits);
    TEST (testFunction);
    TEST (testVec);
    TEST (testColor);
    TEST (testShear);
    TEST (testMatrix);
    TEST (testMiscMatrixAlgo);
    TEST (testRoots);
    TEST (testFun);
    TEST (testInvert);
    TEST (testInterval);
    TEST (testFrustum);
    TEST (testRandom);
    TEST (testExtractEuler);
    TEST (testExtractSHRT);
    TEST (testQuat);
    TEST (testQuatSetRotation);
    TEST (testQuatSlerp);
    TEST (testLineAlgo);
    TEST (testBoxAlgo);
    TEST (testBox);
    TEST (testProcrustes);
    TEST (testTinySVD);
    TEST (testJacobiEigenSolver);
    TEST (testFrustumTest);
    TEST (testInterop);
    TEST (testNoInterop);
    // NB: If you add a test here, make sure to enumerate it in the
    // CMakeLists.txt so it runs as part of the test suite

    return 0;
}